

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::JavascriptRegExp::HasPropertyQuery
          (JavascriptRegExp *this,PropertyId propertyId,PropertyValueInfo *info)

{
  char cVar1;
  ScriptContext *pSVar2;
  PropertyQueryFlags PVar3;
  ThreadConfiguration *pTVar4;
  PropertyId PVar5;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  switch(propertyId) {
  case 0x1a1:
    goto switchD_00d179ca_caseD_1a1;
  case 0x1a2:
    goto switchD_00d179ca_caseD_1a2;
  case 0x1a4:
    pTVar4 = (pSVar2->config).threadConfig;
    PVar5 = 0x1a4;
    propertyId = 0x1a4;
    cVar1 = pTVar4->m_ES2018RegExDotAll;
    goto joined_r0x00d17a32;
  case 0x1a6:
    pTVar4 = (pSVar2->config).threadConfig;
    PVar5 = 0x1a6;
    propertyId = 0x1a6;
    cVar1 = pTVar4->m_ES6Unicode;
joined_r0x00d17a32:
    if (cVar1 != '\x01') goto switchD_00d179ca_caseD_1a1;
    break;
  case 0x1a7:
    pTVar4 = (pSVar2->config).threadConfig;
    propertyId = 0x1a7;
    if ((pTVar4->m_ES6RegExSticky == true) && (pTVar4->m_ES6RegExPrototypeProperties != true)) {
      return Property_Found;
    }
    goto switchD_00d179ca_caseD_1a1;
  default:
    if ((propertyId != 0x1e0) && (propertyId != 0x153)) goto switchD_00d179ca_caseD_1a1;
  case 0x1a0:
  case 0x1a3:
  case 0x1a5:
    pTVar4 = (pSVar2->config).threadConfig;
    PVar5 = propertyId;
  }
  propertyId = PVar5;
  if (pTVar4->m_ES6RegExPrototypeProperties == false) {
switchD_00d179ca_caseD_1a2:
    return Property_Found;
  }
switchD_00d179ca_caseD_1a1:
  PVar3 = DynamicObject::HasPropertyQuery(&this->super_DynamicObject,propertyId,info);
  return PVar3;
}

Assistant:

PropertyQueryFlags JavascriptRegExp::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define HAS_PROPERTY(ownProperty) \
        return (ownProperty ? PropertyQueryFlags::Property_Found : DynamicObject::HasPropertyQuery(propertyId, info));

        switch (propertyId)
        {
        case PropertyIds::lastIndex:
            return PropertyQueryFlags::Property_Found;
        case PropertyIds::global:
        case PropertyIds::multiline:
        case PropertyIds::ignoreCase:
        case PropertyIds::source:
        case PropertyIds::options:
            HAS_PROPERTY(!scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::dotAll:
            HAS_PROPERTY(scriptConfig->IsES2018RegExDotAllEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled())
        case PropertyIds::unicode:
            HAS_PROPERTY(scriptConfig->IsES6UnicodeExtensionsEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled())
        case PropertyIds::sticky:
            HAS_PROPERTY(scriptConfig->IsES6RegExStickyEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled())
        default:
            return DynamicObject::HasPropertyQuery(propertyId, info);
        }

#undef HAS_PROPERTY
    }